

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

Metadata google::protobuf::internal::AssignDescriptors
                   (_func_DescriptorTable_ptr *table,once_flag *once,Metadata *metadata)

{
  long *plVar1;
  undefined8 *puVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 *in_FS_OFFSET;
  anon_class_8_1_ba1d2be6_conflict __callable;
  _func_DescriptorTable_ptr *local_30;
  _func_DescriptorTable_ptr **local_28;
  
  local_28 = &local_30;
  plVar1 = (long *)*in_FS_OFFSET;
  *plVar1 = (long)&local_28;
  puVar2 = (undefined8 *)*in_FS_OFFSET;
  *puVar2 = std::once_flag::_Prepare_execution::
            _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
            ::anon_class_1_0_00000001::__invoke;
  local_30 = table;
  iVar3 = pthread_once(&once->_M_once,__once_proxy);
  if (iVar3 == 0) {
    *plVar1 = 0;
    *puVar2 = 0;
    return *metadata;
  }
  uVar4 = std::__throw_system_error(iVar3);
  *plVar1 = 0;
  *puVar2 = 0;
  _Unwind_Resume(uVar4);
}

Assistant:

Metadata AssignDescriptors(const DescriptorTable* (*table)(),
                           internal::once_flag* once,
                           const Metadata& metadata) {
  call_once(*once, [=] {
    auto* t = table();
    AssignDescriptorsImpl(t, t->is_eager);
  });

  return metadata;
}